

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O0

void license::issueLicense
               (parsed_options *parsed,variables_map *vm,char **argv,options_description *global)

{
  bool bVar1;
  value_semantic *pvVar2;
  options_description_easy_init *poVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar5;
  ulong uVar6;
  reference __lhs;
  boost *this;
  reference_type pbVar7;
  ostream *poVar8;
  any *operand;
  exception *ex;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  any *value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>
  *it;
  iterator __end2;
  iterator __begin2;
  variables_map *__range2;
  License license;
  string local_228;
  allocator local_201;
  string local_200;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined8 local_140;
  bool local_135 [5];
  undefined1 local_130 [3];
  bool base64;
  uint magic_num;
  string project_folder;
  string *license_name_ptr;
  string license_name;
  allocator local_d1;
  string local_d0 [32];
  options_description local_b0 [8];
  options_description license_desc;
  options_description *global_local;
  char **argv_local;
  variables_map *vm_local;
  parsed_options *parsed_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"license issue options",&local_d1);
  boost::program_options::options_description::options_description(local_b0,local_d0,0x50,0x28);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::string((string *)&license_name_ptr);
  project_folder.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_130);
  local_135[1] = false;
  local_135[2] = false;
  local_135[3] = false;
  local_135[4] = false;
  local_135[0] = false;
  local_140 = boost::program_options::options_description::add_options(local_b0);
  pvVar2 = (value_semantic *)boost::program_options::bool_switch(local_135);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_140,"base64,b",pvVar2,
                      "Encode license as base64 for inclusion in environment variables.");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"valid-from",(value_semantic *)ptVar4,
                      "Specify the start of the validity for this license.  Format YYYYMMDD. If not specified defaults to today"
                     );
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"valid-to,e",(value_semantic *)ptVar4,
                      "Specify the expire date for this license.  Format YYYYMMDD. If not specified the license won\'t expire"
                     );
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"client-signature,s",(value_semantic *)ptVar4,
                      "The signature of the hardware that requires the license. It should be in the format XXXX-XXXX-XXXX. If not specified the license won\'t be linked to a specific hardware (eg. demo license)."
                     );
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &license_name_ptr);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"output-file-name,o",(value_semantic *)ptVar4,
                      "License output file name. May contain / that will be interpreded as subfolders."
                     );
  ptVar5 = boost::program_options::value<boost::optional<std::__cxx11::string>>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"feature-names,f",(value_semantic *)ptVar5,
                      "Feature names: comma separate list of project features to enable. if not specified will be taken as project name."
                     );
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"primary-key",(value_semantic *)ptVar4,
                      "Primary key location, in case it is not in default folder");
  ptVar4 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130
                     );
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_160,".",&local_161);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_160);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"project-folder,p",(value_semantic *)ptVar4,
                      "path to where project configurations and licenses are stored.");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_188,"0",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b0,"All Versions",&local_1b1);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_188,&local_1b0);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"start-version",(value_semantic *)ptVar4,
                      "Specify the first version of the software this license apply to.");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"0",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"All Versions",&local_201);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_1d8,&local_200);
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"end-version",(value_semantic *)ptVar4,
                      "Specify the last version of the software this license apply to.");
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  poVar3 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar3,"extra-data,x",(value_semantic *)ptVar4,
                      "Specify extra data to be included into the license");
  boost::program_options::options_description_easy_init::operator()
            (poVar3,"help,h","Print this help.");
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"license issue",
             (allocator *)
             ((long)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bVar1 = rerunBoostPO(parsed,local_b0,vm,argv,&local_228,global);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&license.values_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  if (bVar1) {
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      project_folder.field_2._8_8_ = &license_name_ptr;
    }
    License::License((License *)&__range2,(string *)project_folder.field_2._8_8_,(string *)local_130
                     ,(bool)(local_135[0] & 1));
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                      *)(vm + 0x10));
    it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(vm + 0x10));
    while (bVar1 = std::operator!=(&__end2,(_Self *)&it), bVar1) {
      __lhs = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>
              ::operator*(&__end2);
      this = (boost *)boost::program_options::variable_value::value(&__lhs->second);
      bVar1 = std::operator!=(&__lhs->first,"command");
      if (((bVar1) && (bVar1 = std::operator!=(&__lhs->first,"subargs"), bVar1)) &&
         (bVar1 = std::operator!=(&__lhs->first,"base64"), bVar1)) {
        v_1.super_type.m_storage.dummy_._24_8_ = boost::any_cast<std::__cxx11::string>((any *)this);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            v_1.super_type.m_storage.dummy_._24_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          boost::any_cast<boost::optional<std::__cxx11::string>>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&ex,this,operand);
          bVar1 = boost::
                  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&ex);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            poVar8 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
            poVar8 = std::operator<<(poVar8,"not recognized value error");
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          }
          else {
            pbVar7 = boost::
                     optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&ex);
            License::add_parameter((License *)&__range2,&__lhs->first,pbVar7);
          }
          boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&ex);
        }
        else {
          License::add_parameter
                    ((License *)&__range2,&__lhs->first,
                     (string *)v_1.super_type.m_storage.dummy_._24_8_);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>
      ::operator++(&__end2);
    }
    License::write_license((License *)&__range2);
    poVar8 = std::operator<<((ostream *)&std::cout,"License written ");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    License::~License((License *)&__range2);
  }
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&license_name_ptr);
  boost::program_options::options_description::~options_description(local_b0);
  return;
}

Assistant:

static void issueLicense(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
						 const po::options_description &global) {
	po::options_description license_desc("license issue options");
	string license_name;
	string *license_name_ptr = nullptr;
	string project_folder;
	// string output;
	unsigned int magic_num = 0;
	bool base64 = false;
	license_desc.add_options()	//
		(PARAM_BASE64 ",b", po::bool_switch(&base64),
		 "Encode license as base64 for inclusion in environment variables.")  //
		(PARAM_BEGIN_DATE, po::value<string>(),
		 "Specify the start of the validity for this license. "
		 " Format YYYYMMDD. If not specified defaults to today")  //
		(PARAM_EXPIRY_DATE ",e", po::value<string>(),
		 "Specify the expire date for this license. "
		 " Format YYYYMMDD. If not specified the license won't expire")	 //
		(PARAM_CLIENT_SIGNATURE ",s", po::value<string>(),
		 "The signature of the hardware that requires the license. It should be in the format XXXX-XXXX-XXXX."
		 " If not specified the license won't be linked to a specific hardware (eg. demo license).")  //
		(PARAM_LICENSE_OUTPUT ",o", po::value<string>(&license_name),
		 "License output file name. May contain / that will be interpreded as subfolders.")	 //
		(PARAM_FEATURE_NAMES ",f", po::value<boost::optional<std::string>>(),
		 "Feature names: comma separate list of project features to enable. if not specified will be taken as project "
		 "name.")  //
		(PARAM_PRIMARY_KEY, po::value<string>(), "Primary key location, in case it is not in default folder")  //
		(PARAM_PROJECT_FOLDER ",p", po::value<string>(&project_folder)->default_value("."),
		 "path to where project configurations and licenses are stored.")  //
		(PARAM_VERSION_FROM, po::value<string>()->default_value("0", "All Versions"),
		 "Specify the first version of the software this license apply to.")  //
		(PARAM_VERSION_TO, po::value<string>()->default_value("0", "All Versions"),	 //
		 "Specify the last version of the software this license apply to.")	 //
		(PARAM_EXTRA_DATA ",x", po::value<string>(), "Specify extra data to be included into the license")	//
		("help,h", "Print this help.");	 //
	if (rerunBoostPO(parsed, license_desc, vm, argv, "license issue", global)) {
		if (!license_name.empty()) {
			license_name_ptr = &license_name;
		}
		License license(license_name_ptr, project_folder, base64);
		for (const auto &it : vm) {
			auto &value = it.second.value();
			if (it.first != "command" && it.first != "subargs" && it.first != "base64") {
				if (auto v = boost::any_cast<std::string>(&value)) {
					license.add_parameter(it.first, *v);
				} else if (auto v = boost::any_cast<boost::optional<std::string>>(value)) {
					license.add_parameter(it.first, *v);
				} else {
					std::cout << it.first << "not recognized value error" << endl;
				}
			}
		}
		try {
			license.write_license();
			cout << "License written " << endl;
		} catch (exception &ex) {
			cerr << "License writing error: " << ex.what() << endl;
		}
	}
}